

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QCalendarBackend::standaloneMonthName
          (QCalendarBackend *this,QLocale *locale,int month,int param_4,FormatType format)

{
  QCalendarLocale *pQVar1;
  QCalendarLocale *in_RSI;
  QLocalePrivate *in_RDI;
  undefined4 in_R9D;
  QLocalePrivate *monthsData;
  undefined4 in_stack_ffffffffffffffd8;
  
  monthsData = in_RDI;
  ::QSharedDataPointer::operator_cast_to_QLocalePrivate_
            ((QSharedDataPointer<QLocalePrivate> *)0x4d2436);
  (**(code **)(*(long *)in_RSI + 200))();
  pQVar1 = getMonthDataFor(in_RDI,in_RSI);
  (**(code **)(*(long *)in_RSI + 0xd0))();
  rawStandaloneMonthName
            ((QCalendarLocale *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),(char16_t *)monthsData,
             (int)((ulong)pQVar1 >> 0x20),(FormatType)pQVar1);
  return (QString *)monthsData;
}

Assistant:

QString QCalendarBackend::standaloneMonthName(const QLocale &locale, int month, int,
                                              QLocale::FormatType format) const
{
    Q_ASSERT(month >= 1 && month <= maximumMonthsInYear());
    return rawStandaloneMonthName(getMonthDataFor(locale.d, localeMonthIndexData()),
                                  localeMonthData(), month, format);
}